

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O0

string * __thiscall
oout::FmtJunitXml::error(string *__return_storage_ptr__,FmtJunitXml *this,string *text)

{
  ostream *poVar1;
  ostringstream local_198 [8];
  ostringstream out;
  string *text_local;
  FmtJunitXml *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"<error><![CDATA[");
  poVar1 = std::operator<<(poVar1,(string *)text);
  poVar1 = std::operator<<(poVar1,"]]></error>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string error(const string &text) const override
	{
		ostringstream out;
		out << "<error><![CDATA[" << text << "]]></error>" << endl;
		return out.str();
	}